

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupZero(Gia_Man_t *p)

{
  char *__s;
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  Gia_Man_t *p_00;
  size_t sVar3;
  char *__dest;
  Gia_Obj_t *pGVar4;
  int iVar5;
  
  p_00 = Gia_ManStart(p->vCis->nSize + p->vCos->nSize + 1);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar3 = strlen(__s);
    __dest = (char *)malloc(sVar3 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  if (0 < p->vCis->nSize) {
    iVar5 = 0;
    do {
      pGVar4 = Gia_ManAppendObj(p_00);
      uVar1 = *(ulong *)pGVar4;
      *(ulong *)pGVar4 = uVar1 | 0x9fffffff;
      *(ulong *)pGVar4 =
           uVar1 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar2 = p_00->pObjs;
      if ((pGVar4 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar4)) {
LAB_001da69a:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar4 - (long)pGVar2) >> 2) * -0x55555555);
      if ((pGVar4 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar4)) goto LAB_001da69a;
      iVar5 = iVar5 + 1;
    } while (iVar5 < p->vCis->nSize);
  }
  if (0 < p->vCos->nSize) {
    iVar5 = 0;
    do {
      Gia_ManAppendCo(p_00,0);
      iVar5 = iVar5 + 1;
    } while (iVar5 < p->vCos->nSize);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupZero( Gia_Man_t * p )
{
    Gia_Man_t * pNew; int i;
    pNew = Gia_ManStart( 1 + Gia_ManCiNum(p) + Gia_ManCoNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    for ( i = 0; i < Gia_ManCiNum(p); i++ )
        Gia_ManAppendCi( pNew );
    for ( i = 0; i < Gia_ManCoNum(p); i++ )
        Gia_ManAppendCo( pNew, 0 );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}